

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O1

Result * CoreML::validateMultiFunctionDescription
                   (Result *__return_storage_ptr__,ModelDescription *interface,int modelVersion,
                   ValidationPolicy *validationPolicy)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  pointer pbVar3;
  pointer *ppbVar4;
  Rep *pRVar5;
  FunctionDescription *interface_00;
  uint uVar6;
  bool bVar7;
  long *plVar8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  undefined8 *puVar10;
  uint uVar11;
  size_type *psVar12;
  string *psVar13;
  ulong uVar14;
  uint __val;
  pointer pbVar15;
  pointer pcVar16;
  undefined8 uVar17;
  _Alloc_hider _Var18;
  long lVar19;
  long lVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  uint __len;
  string __str;
  string local_110;
  string *local_f0;
  long local_e8;
  undefined1 local_e0 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  ModelDescription *local_48;
  void **local_40;
  ulong local_38;
  
  if (validationPolicy->allowsMultipleFunctions == false) {
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"This model type doesn\'t support multi-function syntax.","");
    Result::Result(__return_storage_ptr__,MODEL_TYPE_DOES_NOT_SUPPORT_MULTI_FUNCTION,&local_110);
    local_a8.field_2._M_allocated_capacity = local_110.field_2._M_allocated_capacity;
    _Var18._M_p = local_110._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p == &local_110.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_00307450;
  }
  local_38 = (ulong)(uint)modelVersion;
  if (8 < modelVersion) {
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar5 = (interface->functions_).super_RepeatedPtrFieldBase.rep_;
    local_40 = pRVar5->elements;
    if (pRVar5 == (Rep *)0x0) {
      local_40 = (void **)0x0;
    }
    lVar20 = (long)(interface->functions_).super_RepeatedPtrFieldBase.current_size_;
    local_e0._16_8_ = __return_storage_ptr__;
    local_48 = interface;
    if (lVar20 != 0) {
      paVar1 = &(__return_storage_ptr__->m_message).field_2;
      lVar19 = 0;
      do {
        interface_00 = *(FunctionDescription **)((long)local_40 + lVar19);
        validateFeatureDescriptions<CoreML::Specification::FunctionDescription>
                  (__return_storage_ptr__,interface_00,(int)local_38,validationPolicy);
        bVar7 = Result::good(__return_storage_ptr__);
        if ((!bVar7) ||
           (std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_68,
                        (value_type *)
                        ((ulong)(interface_00->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe)),
           __return_storage_ptr__ = (Result *)local_e0._16_8_, !bVar7)) goto LAB_003075ff;
        pcVar16 = (((string *)(local_e0._16_8_ + 8))->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar16 != paVar1) {
          operator_delete(pcVar16,paVar1->_M_allocated_capacity + 1);
        }
        lVar19 = lVar19 + 8;
      } while (lVar20 * 8 != lVar19);
    }
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((ulong)(local_48->defaultfunctionname_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    _Var9 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      (local_68.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_68.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,__rhs);
    if (_Var9._M_current !=
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      Result::Result(__return_storage_ptr__);
      goto LAB_003075ff;
    }
    std::operator+(&local_88,"The default function name \'",__rhs);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_88);
    psVar13 = (string *)(plVar8 + 2);
    if ((string *)*plVar8 == psVar13) {
      local_e0._0_8_ = (psVar13->_M_dataplus)._M_p;
      local_e0._8_8_ = plVar8[3];
      local_f0 = (string *)local_e0;
    }
    else {
      local_e0._0_8_ = (psVar13->_M_dataplus)._M_p;
      local_f0 = (string *)*plVar8;
    }
    local_e8 = plVar8[1];
    *plVar8 = (long)psVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    ppbVar4 = &local_c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,",","");
    componentsJoinedBy<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_a8,(CoreML *)&local_68,&local_c8,psVar13);
    pcVar16 = (pointer)0xf;
    if (local_f0 != (string *)local_e0) {
      pcVar16 = (pointer)local_e0._0_8_;
    }
    if (pcVar16 < (pointer)(local_a8._M_string_length + local_e8)) {
      uVar17 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        uVar17 = local_a8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < (pointer)(local_a8._M_string_length + local_e8)) goto LAB_003074fa;
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)local_f0);
    }
    else {
LAB_003074fa:
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_a8._M_dataplus._M_p);
    }
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    puVar2 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar2) {
      local_110.field_2._M_allocated_capacity = *puVar2;
      local_110.field_2._8_8_ = puVar10[3];
    }
    else {
      local_110.field_2._M_allocated_capacity = *puVar2;
      local_110._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_110._M_string_length = puVar10[1];
    *puVar10 = puVar2;
    puVar10[1] = 0;
    *(undefined1 *)puVar2 = 0;
    Result::Result((Result *)local_e0._16_8_,INVALID_DEFAULT_FUNCTION_NAME,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,
                      (ulong)(local_110.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,(ulong)(local_a8.field_2._M_allocated_capacity + 1))
      ;
    }
    if (local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar4) {
      operator_delete(local_c8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((local_c8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (local_f0 != (string *)local_e0) {
      operator_delete(local_f0,(ulong)(local_e0._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
LAB_003075ff:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    return (Result *)local_e0._16_8_;
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_a8,'\x01');
  *local_a8._M_dataplus._M_p = '9';
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x3dbb07);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  psVar12 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_88.field_2._M_allocated_capacity = *psVar12;
    local_88.field_2._8_8_ = plVar8[3];
  }
  else {
    local_88.field_2._M_allocated_capacity = *psVar12;
    local_88._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_88._M_string_length = plVar8[1];
  *plVar8 = (long)psVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_88);
  psVar13 = (string *)(plVar8 + 2);
  if ((string *)*plVar8 == psVar13) {
    local_e0._0_8_ = (psVar13->_M_dataplus)._M_p;
    local_e0._8_8_ = plVar8[3];
    local_f0 = (string *)local_e0;
  }
  else {
    local_e0._0_8_ = (psVar13->_M_dataplus)._M_p;
    local_f0 = (string *)*plVar8;
  }
  local_e8 = plVar8[1];
  *plVar8 = (long)psVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  __val = -modelVersion;
  if (0 < modelVersion) {
    __val = modelVersion;
  }
  __len = 1;
  if (9 < __val) {
    uVar14 = (ulong)__val;
    uVar6 = 4;
    do {
      __len = uVar6;
      uVar11 = (uint)uVar14;
      if (uVar11 < 100) {
        __len = __len - 2;
        goto LAB_003072dc;
      }
      if (uVar11 < 1000) {
        __len = __len - 1;
        goto LAB_003072dc;
      }
      if (uVar11 < 10000) goto LAB_003072dc;
      uVar14 = uVar14 / 10000;
      uVar6 = __len + 4;
    } while (99999 < uVar11);
    __len = __len + 1;
  }
LAB_003072dc:
  ppbVar4 = &local_c8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar4;
  std::__cxx11::string::_M_construct((ulong)&local_c8,(char)__len - (char)(modelVersion >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)modelVersion >> 0x1f) +
                     (long)local_c8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start),__len,__val);
  pbVar3 = (pointer)((long)&((local_c8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p +
                    local_e8);
  pbVar15 = (pointer)0xf;
  if (local_f0 != (string *)local_e0) {
    pbVar15 = (pointer)local_e0._0_8_;
  }
  if (pbVar15 < pbVar3) {
    pbVar15 = (pointer)0xf;
    if (local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar4) {
      pbVar15 = local_c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    if (pbVar15 < pbVar3) goto LAB_0030734c;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_f0);
  }
  else {
LAB_0030734c:
    puVar10 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&local_f0,
                         (ulong)local_c8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  puVar2 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2) {
    local_110.field_2._M_allocated_capacity = *puVar2;
    local_110.field_2._8_8_ = puVar10[3];
  }
  else {
    local_110.field_2._M_allocated_capacity = *puVar2;
    local_110._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_110._M_string_length = puVar10[1];
  *puVar10 = puVar2;
  puVar10[1] = 0;
  *(undefined1 *)puVar2 = 0;
  Result::Result(__return_storage_ptr__,INVALID_COMPATIBILITY_VERSION,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,(ulong)(local_110.field_2._M_allocated_capacity + 1))
    ;
  }
  if (local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar4) {
    operator_delete(local_c8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_c8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_f0 != (string *)local_e0) {
    operator_delete(local_f0,(ulong)(local_e0._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  _Var18._M_p = local_a8._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
    return __return_storage_ptr__;
  }
LAB_00307450:
  operator_delete(_Var18._M_p,(ulong)(local_a8.field_2._M_allocated_capacity + 1));
  return __return_storage_ptr__;
}

Assistant:

Result validateMultiFunctionDescription(const Specification::ModelDescription& interface, int modelVersion, const ValidationPolicy& validationPolicy) {
        if (!validationPolicy.allowsMultipleFunctions) {
            return  Result(ResultType::MODEL_TYPE_DOES_NOT_SUPPORT_MULTI_FUNCTION,
                           "This model type doesn't support multi-function syntax.");
        }

        if (modelVersion < MLMODEL_SPECIFICATION_VERSION_IOS18) {
            return  Result(ResultType::INVALID_COMPATIBILITY_VERSION,
                           "Multi-function syntax is only valid in specification verison >= " + std::to_string(MLMODEL_SPECIFICATION_VERSION_IOS18)+
                           ". This model has version " + std::to_string(modelVersion));
        }

        const auto& functions = interface.functions();
        auto functionNames = std::vector<std::string>();
        for (const auto& function: functions) {
            Result r = validateFeatureDescriptions(function, modelVersion, validationPolicy);
            if (!r.good()) {
                return r;
            }
            functionNames.push_back(function.name());
        }

        // The default function name must be in function name list.
        const auto& defaultFunctionName = interface.defaultfunctionname();
        if (find(functionNames.begin(), functionNames.end(), defaultFunctionName) == functionNames.end()) {
            return  Result(ResultType::INVALID_DEFAULT_FUNCTION_NAME,
                           "The default function name '" + defaultFunctionName + "' is not found in the function name list: " + componentsJoinedBy(functionNames, ","));
        }

        return Result();
    }